

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextQueueUndockNode(ImGuiContext *ctx,ImGuiDockNode *node)

{
  ImGuiDockRequest req;
  ImGuiDockRequest *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb4;
  
  ImGuiDockRequest::ImGuiDockRequest((ImGuiDockRequest *)&stack0xffffffffffffffb0);
  ImVector<ImGuiDockRequest>::push_back
            ((ImVector<ImGuiDockRequest> *)CONCAT44(in_stack_ffffffffffffffb4,2),
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ImGui::DockContextQueueUndockNode(ImGuiContext* ctx, ImGuiDockNode* node)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetNode = node;
    ctx->DockContext->Requests.push_back(req);
}